

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptBitsChk(poptBits bits,char *s)

{
  size_t size;
  int iVar1;
  ulong uVar2;
  uint32_t h1;
  uint32_t h0;
  uint32_t local_20;
  uint32_t local_1c;
  
  if (s == (char *)0x0) {
    size = 0;
  }
  else {
    size = strlen(s);
  }
  local_1c = 0;
  local_20 = 0;
  iVar1 = -0x14;
  if (size != 0 && bits != (poptBits)0x0) {
    poptJlu32lpair(s,size,&local_1c,&local_20);
    uVar2 = (ulong)_poptBitsK;
    if (uVar2 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      do {
        uVar2 = uVar2 - 1;
        if ((bits[(ulong)local_1c % (ulong)_poptBitsM >> 5].bits[0] >>
             ((uint)((ulong)local_1c % (ulong)_poptBitsM) & 0x1f) & 1) == 0) {
          return 0;
        }
        local_1c = local_1c + local_20;
      } while (uVar2 != 0);
    }
  }
  return iVar1;
}

Assistant:

int poptBitsChk(poptBits bits, const char * s)
{
    size_t ns = (s ? strlen(s) : 0);
    uint32_t h0 = 0;
    uint32_t h1 = 0;
    int rc = 1;

    if (bits == NULL || ns == 0)
	return POPT_ERROR_NULLARG;

    poptJlu32lpair(s, ns, &h0, &h1);

    for (ns = 0; ns < (size_t)_poptBitsK; ns++) {
        uint32_t h = h0 + ns * h1;
        uint32_t ix = (h % _poptBitsM);
        if (PBM_ISSET(ix, bits))
            continue;
        rc = 0;
        break;
    }
    return rc;
}